

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O2

int get_branchlength(uint32_t **pptrptr,int *minptr,int *errcodeptr,int *lcptr,
                    parsed_recurse_check *recurses,compile_block_8 *cb)

{
  int iVar1;
  BOOL BVar2;
  parsed_recurse_check *ppVar3;
  uint32_t *puVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint16_t *puVar12;
  uint32_t uVar13;
  uint *puVar14;
  uint32_t uVar15;
  uint *local_98;
  compile_block_8 *local_90;
  int groupminlength;
  parsed_recurse_check *local_80;
  int *local_78;
  size_t local_70;
  int *local_68;
  uint32_t **local_60;
  int *local_58;
  PCRE2_SPTR8 local_50;
  uint *local_48;
  parsed_recurse_check this_recurse;
  
  puVar4 = *pptrptr;
  iVar11 = *lcptr;
  *lcptr = iVar11 + 1;
  if (2000 < iVar11) {
    *errcodeptr = 0x87;
    return -1;
  }
  uVar5 = 0;
  uVar6 = 0;
  iVar11 = 0;
  uVar9 = 0;
  local_90 = cb;
  local_80 = recurses;
  local_78 = lcptr;
  local_60 = pptrptr;
  local_58 = minptr;
LAB_00182d76:
  uVar13 = 1;
  uVar10 = *puVar4;
  local_98 = puVar4;
  if (-1 < (int)uVar10) goto switchD_00182dde_caseD_b;
  uVar8 = 0;
  uVar15 = 0;
  switch(uVar10 + 0x7fff0000 >> 0x10) {
  case 0:
  case 0x18:
    goto switchD_00182dde_caseD_0;
  case 1:
  case 0x19:
  case 0x21:
    goto switchD_00182dde_caseD_1;
  case 2:
    if (((cb->external_options & 0x200) != 0) || ((cb->external_flags & 0x200000) != 0))
    goto switchD_00182dde_caseD_a;
    uVar13 = uVar10 & 0xffff;
    if (9 < uVar13) goto LAB_001830d5;
    sVar7 = cb->small_ref_offset[uVar13];
    goto LAB_001830ea;
  case 3:
    if ((cb->external_options & 0x200) != 0) goto switchD_00182dde_caseD_a;
  case 0x20:
    uVar5 = puVar4[1];
    local_98 = puVar4 + 3;
    local_70 = CONCAT44(puVar4[2],puVar4[3]);
    local_50 = cb->start_pattern + local_70;
    puVar12 = &cb->named_groups->isdup;
    uVar8 = 0;
    local_68 = errcodeptr;
    while( true ) {
      if (cb->names_found <= uVar8) goto LAB_00183286;
      if ((uVar5 == puVar12[-1]) &&
         (iVar1 = coda__pcre2_strncmp_8
                            (local_50,((named_group_8 *)(puVar12 + -7))->name,(ulong)uVar5),
         cb = local_90, iVar1 == 0)) break;
      uVar8 = uVar8 + 1;
      puVar12 = puVar12 + 8;
    }
    uVar13 = *(uint32_t *)(puVar12 + -3);
    if (uVar13 == 0) {
LAB_00183286:
      *local_68 = 0x73;
      cb->erroroffset = local_70;
      return -1;
    }
    sVar7 = local_70;
    errcodeptr = local_68;
    if (((uVar10 & 0xffff0000) != 0x80210000) &&
       ((*puVar12 != 0 || ((local_90->external_flags & 0x200000) != 0))))
    goto switchD_00182dde_caseD_a;
LAB_001830ea:
    if (cb->bracount < uVar13) {
      cb->erroroffset = sVar7;
      *errcodeptr = 0x73;
      return -1;
    }
    if (uVar13 != 0) {
      puVar14 = cb->parsed_pattern;
      do {
        if ((*puVar14 & 0xffff0000) == 0x80050000) {
          puVar14 = puVar14 + 1;
        }
        else if (*puVar14 == (uVar13 | 0x80080000)) goto LAB_00183138;
        puVar14 = puVar14 + 1;
      } while( true );
    }
    goto switchD_00182dde_caseD_a;
  case 4:
switchD_00182dde_caseD_4:
    local_98 = puVar4 + 1;
  case 0xb:
  case 0x16:
switchD_00182dde_caseD_b:
    uVar10 = 1;
LAB_00182d81:
    uVar5 = 1;
    goto LAB_00182d84;
  case 5:
    local_98 = puVar4 + 3;
    break;
  case 6:
    local_98 = puVar4 + 5;
    break;
  case 7:
    uVar8 = uVar10 & 0xffff;
    goto switchD_00182dde_caseD_1;
  case 8:
  case 0x15:
  case 0x2b:
  case 0x2d:
  case 0x2f:
  case 0x31:
    break;
  case 9:
  case 0xd:
    uVar10 = 1;
    local_98 = parsed_skip(puVar4,1);
    cb = local_90;
    uVar5 = 1;
    if (local_98 == (uint32_t *)0x0) goto LAB_001832d5;
    goto LAB_00182d84;
  default:
    goto switchD_00182dde_caseD_a;
  case 0xe:
    local_98 = puVar4 + 1;
    goto LAB_00182de7;
  case 0xf:
    local_98 = parsed_skip(puVar4 + 1,2);
    cb = local_90;
    break;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
    local_98 = puVar4 + 4;
LAB_00182de7:
    uVar8 = 0;
    goto LAB_0018308b;
  case 0x17:
    if ((short)uVar10 != 0x11) {
      uVar10 = uVar10 & 0xffff;
      if (uVar10 == 0x16) {
        return -1;
      }
      if (0x10 < uVar10 - 6) break;
      if ((uVar10 == 0xe) && ((cb->external_options & 0x80000) != 0)) {
        *errcodeptr = 0x88;
        return -1;
      }
      if (uVar10 - 0xf < 2) goto switchD_00182dde_caseD_4;
      goto switchD_00182dde_caseD_b;
    }
    uVar10 = 2;
    goto LAB_00182d81;
  case 0x1a:
    local_98 = puVar4 + 2;
    break;
  case 0x1f:
LAB_001830d5:
    uVar13 = uVar10 & 0xffff;
    sVar7 = CONCAT44(puVar4[1],puVar4[2]);
    local_98 = puVar4 + 2;
    goto LAB_001830ea;
  case 0x22:
  case 0x23:
  case 0x26:
    iVar1 = check_lookbehinds(puVar4 + 1,&local_98,local_80,cb,local_78);
    *errcodeptr = iVar1;
    if (iVar1 != 0) {
      return -1;
    }
    uVar5 = local_98[1] << 0x10 | local_98[1] + 0x7fcc0000 >> 0x10;
    cb = local_90;
    if (uVar5 < 9) {
      local_98 = local_98 + 1;
    }
    else if (uVar5 - 9 < 3) {
      local_98 = local_98 + 3;
    }
    break;
  case 0x24:
  case 0x25:
  case 0x27:
    BVar2 = set_lookbehind_lengths(&local_98,errcodeptr,local_78,local_80,cb);
    uVar10 = 0;
    cb = local_90;
    uVar5 = 0;
    if (BVar2 == 0) {
      return -1;
    }
    goto LAB_00182d94;
  case 0x28:
  case 0x2c:
  case 0x2e:
  case 0x30:
  case 0x32:
    local_98 = puVar4 + (puVar4[1] + 1);
    break;
  case 0x29:
  case 0x2a:
    puVar4 = parsed_skip(puVar4,0);
    if (puVar4 == (uint32_t *)0x0) goto LAB_001832d5;
switchD_00182dde_caseD_0:
    *local_60 = puVar4;
    *local_58 = iVar11;
    return uVar9;
  case 0x39:
  case 0x3a:
  case 0x3b:
    goto LAB_00182eb0;
  case 0x3c:
  case 0x3d:
  case 0x3e:
    uVar15 = puVar4[1];
    uVar13 = puVar4[2];
    local_98 = puVar4 + 2;
    if (uVar13 == 0x10000) goto switchD_00182dde_caseD_a;
LAB_00182eb0:
    iVar1 = (int)uVar6;
    if (((iVar1 == 0) || (uVar13 == 0)) || (uVar13 - 1 <= (uint)((uVar9 ^ 0x7fffffff) / uVar6))) {
      uVar10 = 0;
      uVar8 = 0;
      if (uVar15 == 0) {
        uVar8 = uVar5;
      }
      uVar5 = (uVar15 - 1) * uVar5;
      if (uVar15 == 0) {
        uVar5 = uVar10;
      }
      iVar11 = iVar11 - uVar8;
      if (uVar13 != 0) {
        uVar10 = (uVar13 - 1) * iVar1;
        goto LAB_00182d84;
      }
      uVar9 = uVar9 - iVar1;
      goto LAB_00182d94;
    }
LAB_0018326c:
    *errcodeptr = 0xbb;
    return -1;
  }
  uVar10 = 0;
  uVar5 = 0;
  goto LAB_00182d94;
switchD_00182dde_caseD_1:
  local_98 = puVar4 + 1;
LAB_0018308b:
  uVar10 = get_grouplength(&local_98,&groupminlength,1,errcodeptr,local_78,uVar8,local_80,cb);
  cb = local_90;
  uVar5 = groupminlength;
  if ((int)uVar10 < 0) {
    return -1;
  }
  goto LAB_00182d84;
LAB_00183138:
  local_48 = puVar14;
  puVar4 = parsed_skip(puVar14 + 1,2);
  if (puVar4 == (uint32_t *)0x0) {
LAB_001832d5:
    *errcodeptr = 0xbe;
    return -1;
  }
  ppVar3 = local_80;
  if (local_98 <= puVar14 || puVar4 <= local_98) {
    for (; ppVar3 != (parsed_recurse_check *)0x0; ppVar3 = ppVar3->prev) {
      if (ppVar3->groupptr == puVar14) goto switchD_00182dde_caseD_a;
    }
    this_recurse.prev = local_80;
    local_48 = puVar14 + 1;
    this_recurse.groupptr = puVar14;
    uVar10 = get_grouplength(&local_48,&groupminlength,0,errcodeptr,local_78,uVar13,&this_recurse,
                             local_90);
    cb = local_90;
    uVar5 = groupminlength;
    if (-1 < (int)uVar10) {
LAB_00182d84:
      if ((int)(uVar9 ^ 0x7fffffff) < (int)uVar10) goto LAB_0018326c;
LAB_00182d94:
      uVar9 = uVar9 + uVar10;
      if (0xffff < (int)uVar9) goto LAB_0018326c;
      iVar11 = iVar11 + uVar5;
      puVar4 = local_98 + 1;
      uVar6 = (ulong)uVar10;
      goto LAB_00182d76;
    }
    if (*errcodeptr != 0) {
      return -1;
    }
  }
switchD_00182dde_caseD_a:
  *errcodeptr = 0x7d;
  return -1;
}

Assistant:

static int
get_branchlength(uint32_t **pptrptr, int *minptr, int *errcodeptr, int *lcptr,
  parsed_recurse_check *recurses, compile_block *cb)
{
int branchlength = 0;
int branchminlength = 0;
int grouplength, groupminlength;
uint32_t lastitemlength = 0;
uint32_t lastitemminlength = 0;
uint32_t *pptr = *pptrptr;
PCRE2_SIZE offset;
parsed_recurse_check this_recurse;

/* A large and/or complex regex can take too long to process. This can happen
more often when (?| groups are present in the pattern because their length
cannot be cached. */

if ((*lcptr)++ > 2000)
  {
  *errcodeptr = ERR35;  /* Lookbehind is too complicated */
  return -1;
  }

/* Scan the branch, accumulating the length. */

for (;; pptr++)
  {
  parsed_recurse_check *r;
  uint32_t *gptr, *gptrend;
  uint32_t escape;
  uint32_t group = 0;
  uint32_t itemlength = 0;
  uint32_t itemminlength = 0;
  uint32_t min, max;

  if (*pptr < META_END)
    {
    itemlength = itemminlength = 1;
    }

  else switch (META_CODE(*pptr))
    {
    case META_KET:
    case META_ALT:
    goto EXIT;

    /* (*ACCEPT) and (*FAIL) terminate the branch, but we must skip to the
    actual termination. */

    case META_ACCEPT:
    case META_FAIL:
    pptr = parsed_skip(pptr, PSKIP_ALT);
    if (pptr == NULL) goto PARSED_SKIP_FAILED;
    goto EXIT;

    case META_MARK:
    case META_COMMIT_ARG:
    case META_PRUNE_ARG:
    case META_SKIP_ARG:
    case META_THEN_ARG:
    pptr += pptr[1] + 1;
    break;

    case META_CIRCUMFLEX:
    case META_COMMIT:
    case META_DOLLAR:
    case META_PRUNE:
    case META_SKIP:
    case META_THEN:
    break;

    case META_OPTIONS:
    pptr += 2;
    break;

    case META_BIGVALUE:
    itemlength = itemminlength = 1;
    pptr += 1;
    break;

    case META_CLASS:
    case META_CLASS_NOT:
    itemlength = itemminlength = 1;
    pptr = parsed_skip(pptr, PSKIP_CLASS);
    if (pptr == NULL) goto PARSED_SKIP_FAILED;
    break;

    case META_CLASS_EMPTY_NOT:
    case META_DOT:
    itemlength = itemminlength = 1;
    break;

    case META_CALLOUT_NUMBER:
    pptr += 3;
    break;

    case META_CALLOUT_STRING:
    pptr += 3 + SIZEOFFSET;
    break;

    /* Only some escapes consume a character. Of those, \R can match one or two
    characters, but \X is never allowed because it matches an unknown number of
    characters. \C is allowed only in 32-bit and non-UTF 8/16-bit modes. */

    case META_ESCAPE:
    escape = META_DATA(*pptr);
    if (escape == ESC_X) return -1;
    if (escape == ESC_R)
      {
      itemminlength = 1;
      itemlength = 2;
      }
    else if (escape > ESC_b && escape < ESC_Z)
      {
#if PCRE2_CODE_UNIT_WIDTH != 32
      if ((cb->external_options & PCRE2_UTF) != 0 && escape == ESC_C)
        {
        *errcodeptr = ERR36;
        return -1;
        }
#endif
      itemlength = itemminlength = 1;
      if (escape == ESC_p || escape == ESC_P) pptr++;  /* Skip prop data */
      }
    break;

    /* Lookaheads do not contribute to the length of this branch, but they may
    contain lookbehinds within them whose lengths need to be set. */

    case META_LOOKAHEAD:
    case META_LOOKAHEADNOT:
    case META_LOOKAHEAD_NA:
    *errcodeptr = check_lookbehinds(pptr + 1, &pptr, recurses, cb, lcptr);
    if (*errcodeptr != 0) return -1;

    /* Ignore any qualifiers that follow a lookahead assertion. */

    switch (pptr[1])
      {
      case META_ASTERISK:
      case META_ASTERISK_PLUS:
      case META_ASTERISK_QUERY:
      case META_PLUS:
      case META_PLUS_PLUS:
      case META_PLUS_QUERY:
      case META_QUERY:
      case META_QUERY_PLUS:
      case META_QUERY_QUERY:
      pptr++;
      break;

      case META_MINMAX:
      case META_MINMAX_PLUS:
      case META_MINMAX_QUERY:
      pptr += 3;
      break;

      default:
      break;
      }
    break;

    /* A nested lookbehind does not contribute any length to this lookbehind,
    but must itself be checked and have its lengths set. */

    case META_LOOKBEHIND:
    case META_LOOKBEHINDNOT:
    case META_LOOKBEHIND_NA:
    if (!set_lookbehind_lengths(&pptr, errcodeptr, lcptr, recurses, cb))
      return -1;
    break;

    /* Back references and recursions are handled by very similar code. At this
    stage, the names generated in the parsing pass are available, but the main
    name table has not yet been created. So for the named varieties, scan the
    list of names in order to get the number of the first one in the pattern,
    and whether or not this name is duplicated. */

    case META_BACKREF_BYNAME:
    if ((cb->external_options & PCRE2_MATCH_UNSET_BACKREF) != 0)
      goto ISNOTFIXED;
    /* Fall through */

    case META_RECURSE_BYNAME:
      {
      int i;
      PCRE2_SPTR name;
      BOOL is_dupname = FALSE;
      named_group *ng = cb->named_groups;
      uint32_t meta_code = META_CODE(*pptr);
      uint32_t length = *(++pptr);

      GETPLUSOFFSET(offset, pptr);
      name = cb->start_pattern + offset;
      for (i = 0; i < cb->names_found; i++, ng++)
        {
        if (length == ng->length && PRIV(strncmp)(name, ng->name, length) == 0)
          {
          group = ng->number;
          is_dupname = ng->isdup;
          break;
          }
        }

      if (group == 0)
        {
        *errcodeptr = ERR15;  /* Non-existent subpattern */
        cb->erroroffset = offset;
        return -1;
        }

      /* A numerical back reference can be fixed length if duplicate capturing
      groups are not being used. A non-duplicate named back reference can also
      be handled. */

      if (meta_code == META_RECURSE_BYNAME ||
          (!is_dupname && (cb->external_flags & PCRE2_DUPCAPUSED) == 0))
        goto RECURSE_OR_BACKREF_LENGTH;  /* Handle as a numbered version. */
      }
    goto ISNOTFIXED;                     /* Duplicate name or number */

    /* The offset values for back references < 10 are in a separate vector
    because otherwise they would use more than two parsed pattern elements on
    64-bit systems. */

    case META_BACKREF:
    if ((cb->external_options & PCRE2_MATCH_UNSET_BACKREF) != 0 ||
        (cb->external_flags & PCRE2_DUPCAPUSED) != 0)
      goto ISNOTFIXED;
    group = META_DATA(*pptr);
    if (group < 10)
      {
      offset = cb->small_ref_offset[group];
      goto RECURSE_OR_BACKREF_LENGTH;
      }

    /* Fall through */
    /* For groups >= 10 - picking up group twice does no harm. */

    /* A true recursion implies not fixed length, but a subroutine call may
    be OK. Back reference "recursions" are also failed. */

    case META_RECURSE:
    group = META_DATA(*pptr);
    GETPLUSOFFSET(offset, pptr);

    RECURSE_OR_BACKREF_LENGTH:
    if (group > cb->bracount)
      {
      cb->erroroffset = offset;
      *errcodeptr = ERR15;  /* Non-existent subpattern */
      return -1;
      }
    if (group == 0) goto ISNOTFIXED;  /* Local recursion */
    for (gptr = cb->parsed_pattern; *gptr != META_END; gptr++)
      {
      if (META_CODE(*gptr) == META_BIGVALUE) gptr++;
        else if (*gptr == (META_CAPTURE | group)) break;
      }

    /* We must start the search for the end of the group at the first meta code
    inside the group. Otherwise it will be treated as an enclosed group. */

    gptrend = parsed_skip(gptr + 1, PSKIP_KET);
    if (gptrend == NULL) goto PARSED_SKIP_FAILED;
    if (pptr > gptr && pptr < gptrend) goto ISNOTFIXED;  /* Local recursion */
    for (r = recurses; r != NULL; r = r->prev) if (r->groupptr == gptr) break;
    if (r != NULL) goto ISNOTFIXED;   /* Mutual recursion */
    this_recurse.prev = recurses;
    this_recurse.groupptr = gptr;

    /* We do not need to know the position of the end of the group, that is,
    gptr is not used after the call to get_grouplength(). Setting the second
    argument FALSE stops it scanning for the end when the length can be found
    in the cache. */

    gptr++;
    grouplength = get_grouplength(&gptr, &groupminlength, FALSE, errcodeptr,
      lcptr, group, &this_recurse, cb);
    if (grouplength < 0)
      {
      if (*errcodeptr == 0) goto ISNOTFIXED;
      return -1;  /* Error already set */
      }
    itemlength = grouplength;
    itemminlength = groupminlength;
    break;

    /* A (DEFINE) group is never obeyed inline and so it does not contribute to
    the length of this branch. Skip from the following item to the next
    unpaired ket. */

    case META_COND_DEFINE:
    pptr = parsed_skip(pptr + 1, PSKIP_KET);
    break;

    /* Check other nested groups - advance past the initial data for each type
    and then seek a fixed length with get_grouplength(). */

    case META_COND_NAME:
    case META_COND_NUMBER:
    case META_COND_RNAME:
    case META_COND_RNUMBER:
    pptr += 2 + SIZEOFFSET;
    goto CHECK_GROUP;

    case META_COND_ASSERT:
    pptr += 1;
    goto CHECK_GROUP;

    case META_COND_VERSION:
    pptr += 4;
    goto CHECK_GROUP;

    case META_CAPTURE:
    group = META_DATA(*pptr);
    /* Fall through */

    case META_ATOMIC:
    case META_NOCAPTURE:
    case META_SCRIPT_RUN:
    pptr++;
    CHECK_GROUP:
    grouplength = get_grouplength(&pptr, &groupminlength, TRUE, errcodeptr,
      lcptr, group, recurses, cb);
    if (grouplength < 0) return -1;
    itemlength = grouplength;
    itemminlength = groupminlength;
    break;

    case META_QUERY:
    case META_QUERY_PLUS:
    case META_QUERY_QUERY:
    min = 0;
    max = 1;
    goto REPETITION;

    /* Exact repetition is OK; variable repetition is not. A repetition of zero
    must subtract the length that has already been added. */

    case META_MINMAX:
    case META_MINMAX_PLUS:
    case META_MINMAX_QUERY:
    min = pptr[1];
    max = pptr[2];
    pptr += 2;

    REPETITION:
    if (max != REPEAT_UNLIMITED)
      {
      if (lastitemlength != 0 &&  /* Should not occur, but just in case */
          max != 0 &&
          (INT_MAX - branchlength)/lastitemlength < max - 1)
        {
        *errcodeptr = ERR87;  /* Integer overflow; lookbehind too big */
        return -1;
        }
      if (min == 0) branchminlength -= lastitemminlength;
        else itemminlength = (min - 1) * lastitemminlength;
      if (max == 0) branchlength -= lastitemlength;
        else itemlength = (max - 1) * lastitemlength;
      break;
      }
    /* Fall through */

    /* Any other item means this branch does not have a fixed length. */

    default:
    ISNOTFIXED:
    *errcodeptr = ERR25;   /* Not fixed length */
    return -1;
    }

  /* Add the item length to the branchlength, checking for integer overflow and
  for the branch length exceeding the overall limit. Later, if there is at
  least one variable-length branch in the group, there is a test for the
  (smaller) variable-length branch length limit. */

  if (INT_MAX - branchlength < (int)itemlength ||
      (branchlength += itemlength) > LOOKBEHIND_MAX)
    {
    *errcodeptr = ERR87;
    return -1;
    }

  branchminlength += itemminlength;

  /* Save this item length for use if the next item is a quantifier. */

  lastitemlength = itemlength;
  lastitemminlength = itemminlength;
  }

EXIT:
*pptrptr = pptr;
*minptr = branchminlength;
return branchlength;

PARSED_SKIP_FAILED:
*errcodeptr = ERR90;
return -1;
}